

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAux.h
# Opt level: O0

void Assimp::LogFunctions<Assimp::FBXImporter>::LogError(format *message)

{
  bool bVar1;
  Logger *this;
  char *__lhs;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  basic_formatter *local_10;
  format *message_local;
  
  local_10 = (basic_formatter *)message;
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    this = DefaultLogger::get();
    __lhs = Prefix();
    Formatter::basic_formatter::operator_cast_to_string(&local_50,local_10);
    std::operator+(&local_30,__lhs,&local_50);
    Logger::error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

static void LogError(const Formatter::format& message)  {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_ERROR(Prefix()+(std::string)message);
        }
    }